

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char_const*,char[26],char[7],char[8]>
          (string *__return_storage_ptr__,Diligent *this,char **Args,char (*Args_1) [26],
          char (*Args_2) [7],char (*Args_3) [8])

{
  stringstream local_1b8 [8];
  stringstream ss;
  char (*Args_local_3) [8];
  char (*Args_local_2) [7];
  char (*Args_local_1) [26];
  char **Args_local;
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[26],char[7],char[8]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char **)this,(char (*) [26])Args,(char (*) [7])Args_1,(char (*) [8])Args_2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}